

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3RefillIndex(Parse *pParse,Index *pIndex,int memRootPage)

{
  int iCur;
  int p1;
  Table *pTab_00;
  sqlite3 *db_00;
  byte bVar1;
  int iVar2;
  int iVar3;
  int regOut;
  int iVar4;
  Vdbe *p;
  KeyInfo *zP4;
  int j2;
  int iDb;
  sqlite3 *db;
  int regRecord;
  KeyInfo *pKey;
  Vdbe *v;
  int tnum;
  int addr2;
  int addr1;
  int iSorter;
  int iIdx;
  int iTab;
  Table *pTab;
  int memRootPage_local;
  Index *pIndex_local;
  Parse *pParse_local;
  
  pTab_00 = pIndex->pTable;
  iCur = pParse->nTab;
  pParse->nTab = iCur + 1;
  p1 = pParse->nTab;
  pParse->nTab = p1 + 1;
  db_00 = pParse->db;
  iVar2 = sqlite3SchemaToIndex(db_00,pIndex->pSchema);
  iVar3 = sqlite3AuthCheck(pParse,0x1b,pIndex->zName,(char *)0x0,db_00->aDb[iVar2].zName);
  if (iVar3 == 0) {
    sqlite3TableLock(pParse,iVar2,pTab_00->tnum,'\x01',pTab_00->zName);
    p = sqlite3GetVdbe(pParse);
    if (p != (Vdbe *)0x0) {
      v._0_4_ = memRootPage;
      if (memRootPage < 0) {
        v._0_4_ = pIndex->tnum;
        sqlite3VdbeAddOp2(p,0x67,(int)v,iVar2);
      }
      zP4 = sqlite3IndexKeyinfo(pParse,pIndex);
      sqlite3VdbeAddOp4(p,0x28,p1,(int)v,iVar2,(char *)zP4,-0x10);
      bVar1 = 0;
      if (-1 < memRootPage) {
        bVar1 = 2;
      }
      sqlite3VdbeChangeP5(p,bVar1 | 1);
      iVar3 = pParse->nTab;
      pParse->nTab = iVar3 + 1;
      sqlite3VdbeAddOp4(p,0x2b,iVar3,0,0,(char *)zP4,-6);
      sqlite3OpenTable(pParse,iCur,iVar2,pTab_00,0x27);
      iVar2 = sqlite3VdbeAddOp2(p,0x48,iCur,0);
      regOut = sqlite3GetTempReg(pParse);
      sqlite3GenerateIndexKey(pParse,pIndex,iCur,regOut,1);
      sqlite3VdbeAddOp2(p,0x60,iVar3,regOut);
      sqlite3VdbeAddOp2(p,0x5f,iCur,iVar2 + 1);
      sqlite3VdbeJumpHere(p,iVar2);
      iVar2 = sqlite3VdbeAddOp2(p,0x46,iVar3,0);
      if (pIndex->onError == '\0') {
        v._4_4_ = sqlite3VdbeCurrentAddr(p);
      }
      else {
        iVar4 = sqlite3VdbeCurrentAddr(p);
        sqlite3VdbeAddOp2(p,1,0,iVar4 + 3);
        v._4_4_ = sqlite3VdbeCurrentAddr(p);
        sqlite3VdbeAddOp3(p,0x3d,iVar3,iVar4 + 3,regOut);
        sqlite3HaltConstraint(pParse,0x813,2,"indexed columns are not unique",-2);
      }
      sqlite3VdbeAddOp2(p,0x3e,iVar3,regOut);
      sqlite3VdbeAddOp3(p,0x61,p1,regOut,1);
      sqlite3VdbeChangeP5(p,'\x10');
      sqlite3ReleaseTempReg(pParse,regOut);
      sqlite3VdbeAddOp2(p,0x51,iVar3,v._4_4_);
      sqlite3VdbeJumpHere(p,iVar2);
      sqlite3VdbeAddOp1(p,0x2d,iCur);
      sqlite3VdbeAddOp1(p,0x2d,p1);
      sqlite3VdbeAddOp1(p,0x2d,iVar3);
    }
  }
  return;
}

Assistant:

static void sqlite3RefillIndex(Parse *pParse, Index *pIndex, int memRootPage){
  Table *pTab = pIndex->pTable;  /* The table that is indexed */
  int iTab = pParse->nTab++;     /* Btree cursor used for pTab */
  int iIdx = pParse->nTab++;     /* Btree cursor used for pIndex */
  int iSorter;                   /* Cursor opened by OpenSorter (if in use) */
  int addr1;                     /* Address of top of loop */
  int addr2;                     /* Address to jump to for next iteration */
  int tnum;                      /* Root page of index */
  Vdbe *v;                       /* Generate code into this virtual machine */
  KeyInfo *pKey;                 /* KeyInfo for index */
  int regRecord;                 /* Register holding assemblied index record */
  sqlite3 *db = pParse->db;      /* The database connection */
  int iDb = sqlite3SchemaToIndex(db, pIndex->pSchema);

#ifndef SQLITE_OMIT_AUTHORIZATION
  if( sqlite3AuthCheck(pParse, SQLITE_REINDEX, pIndex->zName, 0,
      db->aDb[iDb].zName ) ){
    return;
  }
#endif

  /* Require a write-lock on the table to perform this operation */
  sqlite3TableLock(pParse, iDb, pTab->tnum, 1, pTab->zName);

  v = sqlite3GetVdbe(pParse);
  if( v==0 ) return;
  if( memRootPage>=0 ){
    tnum = memRootPage;
  }else{
    tnum = pIndex->tnum;
    sqlite3VdbeAddOp2(v, OP_Clear, tnum, iDb);
  }
  pKey = sqlite3IndexKeyinfo(pParse, pIndex);
  sqlite3VdbeAddOp4(v, OP_OpenWrite, iIdx, tnum, iDb, 
                    (char *)pKey, P4_KEYINFO_HANDOFF);
  sqlite3VdbeChangeP5(v, OPFLAG_BULKCSR|((memRootPage>=0)?OPFLAG_P2ISREG:0));

  /* Open the sorter cursor if we are to use one. */
  iSorter = pParse->nTab++;
  sqlite3VdbeAddOp4(v, OP_SorterOpen, iSorter, 0, 0, (char*)pKey, P4_KEYINFO);

  /* Open the table. Loop through all rows of the table, inserting index
  ** records into the sorter. */
  sqlite3OpenTable(pParse, iTab, iDb, pTab, OP_OpenRead);
  addr1 = sqlite3VdbeAddOp2(v, OP_Rewind, iTab, 0);
  regRecord = sqlite3GetTempReg(pParse);

  sqlite3GenerateIndexKey(pParse, pIndex, iTab, regRecord, 1);
  sqlite3VdbeAddOp2(v, OP_SorterInsert, iSorter, regRecord);
  sqlite3VdbeAddOp2(v, OP_Next, iTab, addr1+1);
  sqlite3VdbeJumpHere(v, addr1);
  addr1 = sqlite3VdbeAddOp2(v, OP_SorterSort, iSorter, 0);
  if( pIndex->onError!=OE_None ){
    int j2 = sqlite3VdbeCurrentAddr(v) + 3;
    sqlite3VdbeAddOp2(v, OP_Goto, 0, j2);
    addr2 = sqlite3VdbeCurrentAddr(v);
    sqlite3VdbeAddOp3(v, OP_SorterCompare, iSorter, j2, regRecord);
    sqlite3HaltConstraint(pParse, SQLITE_CONSTRAINT_UNIQUE,
        OE_Abort, "indexed columns are not unique", P4_STATIC
    );
  }else{
    addr2 = sqlite3VdbeCurrentAddr(v);
  }
  sqlite3VdbeAddOp2(v, OP_SorterData, iSorter, regRecord);
  sqlite3VdbeAddOp3(v, OP_IdxInsert, iIdx, regRecord, 1);
  sqlite3VdbeChangeP5(v, OPFLAG_USESEEKRESULT);
  sqlite3ReleaseTempReg(pParse, regRecord);
  sqlite3VdbeAddOp2(v, OP_SorterNext, iSorter, addr2);
  sqlite3VdbeJumpHere(v, addr1);

  sqlite3VdbeAddOp1(v, OP_Close, iTab);
  sqlite3VdbeAddOp1(v, OP_Close, iIdx);
  sqlite3VdbeAddOp1(v, OP_Close, iSorter);
}